

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O3

void __thiscall fixedPreciseMeasurement_ops_Test::TestBody(fixedPreciseMeasurement_ops_Test *this)

{
  precise_unit *desired_units;
  double dVar1;
  double dVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  bool bVar4;
  unit_data uVar5;
  char *pcVar6;
  char *in_R9;
  uint uVar7;
  pointer *__ptr;
  pointer *__ptr_2;
  precise_unit pVar8;
  AssertionResult gtest_ar;
  fixed_precise_measurement d1;
  fixed_precise_measurement d2;
  fixed_precise_measurement d4;
  undefined1 local_118 [8];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Stack_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  undefined1 local_f0 [8];
  undefined8 local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  undefined1 local_c0 [8];
  AssertHelperData *local_b8;
  double dStack_b0;
  undefined1 local_a8 [16];
  AssertHelper local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  undefined1 local_88 [16];
  undefined8 uStack_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  undefined1 auStack_60 [8];
  undefined8 uStack_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  undefined1 local_48 [16];
  double dStack_38;
  
  local_88._0_8_ = &DAT_4046800000000000;
  local_88._8_8_ = 0x3ff0000000000000;
  uStack_78 = (double)1;
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_4053c00000000000;
  auStack_60 = (undefined1  [8])0x3ff0000000000000;
  uStack_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)1;
  local_48._0_8_ = 1.0;
  local_48._8_8_ = 0x3fd381d7dbf487fd;
  dStack_38 = (double)1;
  local_118 = (undefined1  [8])&DAT_3ff0000000000000;
  _Stack_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  uVar5 = units::detail::unit_data::operator*((unit_data *)&uStack_78,(unit_data *)&_Stack_110);
  uVar7 = _Stack_110._M_head_impl._4_4_ | uStack_78._4_4_;
  local_d8 = (undefined1  [8])&DAT_40abc60000000000;
  local_f0 = (undefined1  [8])&DAT_40abc60000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_118,"area.value()","45.0 * 79",(double *)local_d8,(double *)local_f0)
  ;
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_110._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((_Alloc_hider *)&(_Stack_110._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2ac,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f0,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f0);
    if (local_d8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_110._M_head_impl
      != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_110._M_head_impl);
  }
  local_118 = (undefined1  [8])&DAT_3ff0000000000000;
  _Stack_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CONCAT44(uVar7,uVar5);
  uVar5 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::m + 8),(unit_data *)(units::precise::m + 8));
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)(uint)uVar5
  ;
  local_f0 = (undefined1  [8])&DAT_3ff0000000000000;
  bVar4 = units::precise_unit::operator==((precise_unit *)local_118,(precise_unit *)local_f0);
  local_d8[0] = bVar4;
  uStack_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_118,(internal *)local_d8,
               (AssertionResult *)"area.units() == precise::m * precise::m","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2ad,(char *)local_118);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
    if (local_118 != (undefined1  [8])&local_108) {
      operator_delete((void *)local_118,local_108._M_allocated_capacity + 1);
    }
    if (local_f0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_f0 + 8))();
    }
    if (uStack_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_d0,uStack_d0);
    }
  }
  uStack_d0 = uStack_58;
  local_d8 = auStack_60;
  local_a8._8_4_ = SUB84((double)auStack_60 * (double)local_88._8_8_,0);
  local_a8._0_8_ = (double)local_68._M_head_impl * (double)local_88._0_8_;
  local_a8._12_4_ = (int)((ulong)((double)auStack_60 * (double)local_88._8_8_) >> 0x20);
  uVar5 = units::detail::unit_data::operator*((unit_data *)&uStack_78,(unit_data *)&uStack_d0);
  local_108._M_allocated_capacity = CONCAT44(uStack_d0._4_4_ | uStack_78._4_4_,uVar5);
  local_118 = (undefined1  [8])local_a8._0_8_;
  _Stack_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._8_8_;
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uStack_78;
  local_f0 = (undefined1  [8])local_88._8_8_;
  local_a8._8_4_ = SUB84((double)local_88._8_8_ * (double)auStack_60,0);
  local_a8._0_8_ = (double)local_88._0_8_ * (double)local_68._M_head_impl;
  local_a8._12_4_ = (int)((ulong)((double)local_88._8_8_ * (double)auStack_60) >> 0x20);
  local_c8._0_4_ =
       units::detail::unit_data::operator*((unit_data *)&uStack_58,(unit_data *)&local_e8);
  local_c8._4_4_ = local_e8._4_4_ | uStack_58._4_4_;
  local_d8 = (undefined1  [8])local_a8._0_8_;
  uStack_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._8_8_;
  bVar4 = units::precise_measurement::operator==
                    ((precise_measurement *)local_118,(precise_measurement *)local_d8);
  local_c0[0] = bVar4;
  local_b8 = (AssertHelperData *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_118,(internal *)local_c0,(AssertionResult *)"d1 * d2 == d2 * d1",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2af,(char *)local_118);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f0,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f0);
    if (local_118 != (undefined1  [8])&local_108) {
      operator_delete((void *)local_118,local_108._M_allocated_capacity + 1);
    }
    if (local_d8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d8 + 8))();
    }
    if (local_b8 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    }
  }
  desired_units = (precise_unit *)(local_88 + 8);
  local_118 = (undefined1  [8])local_68._M_head_impl;
  _Stack_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_60;
  local_108._M_allocated_capacity = (size_type)uStack_58;
  local_a8._0_8_ = local_88._0_8_;
  dVar1 = units::precise_measurement::value_as((precise_measurement *)local_118,desired_units);
  dVar2 = uStack_78;
  local_d8 = (undefined1  [8])(dVar1 + (double)local_a8._0_8_);
  local_a8._0_8_ = local_88._8_8_;
  local_f0 = (undefined1  [8])&DAT_405f000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_118,"sum.value()","45.0 + 79.0",(double *)local_d8,(double *)local_f0
            );
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_110._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((_Alloc_hider *)&(_Stack_110._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2b2,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f0,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f0);
    if (local_d8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_110._M_head_impl
      != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_110._M_head_impl);
  }
  local_118 = (undefined1  [8])local_a8._0_8_;
  _Stack_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)dVar2;
  bVar4 = units::precise_unit::operator==
                    ((precise_unit *)local_118,(precise_unit *)units::precise::m);
  local_d8[0] = bVar4;
  uStack_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_118,(internal *)local_d8,
               (AssertionResult *)"sum.units() == precise::m","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2b3,(char *)local_118);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
    if (local_118 != (undefined1  [8])&local_108) {
      operator_delete((void *)local_118,(ulong)(local_108._M_allocated_capacity + 1));
    }
    if (local_f0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_f0 + 8))();
    }
    if (uStack_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_d0,uStack_d0);
    }
  }
  local_d8 = (undefined1  [8])local_68._M_head_impl;
  uStack_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_60;
  local_c8 = uStack_58;
  local_a8._0_8_ = local_88._0_8_;
  dVar1 = units::precise_measurement::value_as((precise_measurement *)local_d8,desired_units);
  local_118 = (undefined1  [8])(dVar1 + (double)local_a8._0_8_);
  _Stack_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_;
  local_108._M_allocated_capacity = (size_type)uStack_78;
  local_c0 = (undefined1  [8])local_88._0_8_;
  local_b8 = (AssertHelperData *)local_88._8_8_;
  dStack_b0 = uStack_78;
  local_a8._0_8_ = local_68._M_head_impl;
  dVar1 = units::precise_measurement::value_as
                    ((precise_measurement *)local_c0,(precise_unit *)auStack_60);
  local_f0 = (undefined1  [8])(dVar1 + (double)local_a8._0_8_);
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_60;
  pbStack_e0 = uStack_58;
  local_98.data_._0_1_ =
       (internal)
       units::fixed_precise_measurement::operator==
                 ((fixed_precise_measurement *)local_118,(fixed_precise_measurement *)local_f0);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_98.data_._0_1_) {
    testing::Message::Message((Message *)local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_118,(internal *)&local_98,(AssertionResult *)"d1 + d2 == d2 + d1",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2b4,(char *)local_118);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f0,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f0);
    if (local_118 != (undefined1  [8])&local_108) {
      operator_delete((void *)local_118,local_108._M_allocated_capacity + 1);
    }
    if (local_d8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d8 + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
  }
  local_118 = (undefined1  [8])local_88._0_8_;
  _Stack_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_;
  local_108._M_allocated_capacity = (size_type)uStack_78;
  local_a8._0_8_ = local_68._M_head_impl;
  dVar1 = units::precise_measurement::value_as
                    ((precise_measurement *)local_118,(precise_unit *)auStack_60);
  pbVar3 = uStack_58;
  local_d8 = (undefined1  [8])((double)local_a8._0_8_ - dVar1);
  local_a8._0_8_ = auStack_60;
  local_f0 = (undefined1  [8])&DAT_4041000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_118,"diff.value()","79.0 - 45",(double *)local_d8,(double *)local_f0)
  ;
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_d8);
    if ((AssertHelperData *)_Stack_110._M_head_impl == (AssertHelperData *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)_Stack_110._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2b7,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f0,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f0);
    if (local_d8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d8 + 8))();
    }
  }
  if ((AssertHelperData *)_Stack_110._M_head_impl != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_110._M_head_impl);
  }
  local_118 = (undefined1  [8])local_a8._0_8_;
  _Stack_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar3;
  bVar4 = units::precise_unit::operator==
                    ((precise_unit *)local_118,(precise_unit *)units::precise::m);
  local_d8[0] = bVar4;
  uStack_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_118,(internal *)local_d8,
               (AssertionResult *)"diff.units() == precise::m","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2b8,(char *)local_118);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
    if (local_118 != (undefined1  [8])&local_108) {
      operator_delete((void *)local_118,local_108._M_allocated_capacity + 1);
    }
    if (local_f0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_f0 + 8))();
    }
    if (uStack_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_d0,uStack_d0);
    }
  }
  local_a8._0_8_ = (double)local_88._0_8_ / (double)local_68._M_head_impl;
  local_118 = auStack_60;
  _Stack_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)uStack_58;
  pVar8 = units::precise_unit::operator/(desired_units,(precise_unit *)local_118);
  local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pVar8.multiplier_;
  local_d8 = (undefined1  [8])local_a8._0_8_;
  local_f0 = (undefined1  [8])&DAT_3fe23a5440cf6475;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_118,"rat.value()","45.0 / 79.0",(double *)local_d8,(double *)local_f0
            );
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_110._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((_Alloc_hider *)&(_Stack_110._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,699,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f0,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f0);
    if (local_d8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_110._M_head_impl
      != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_110._M_head_impl);
  }
  local_118 = (undefined1  [8])local_50;
  _Stack_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pVar8._8_8_;
  bVar4 = units::precise_unit::operator==
                    ((precise_unit *)local_118,(precise_unit *)units::precise::ratio);
  local_d8[0] = bVar4;
  uStack_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_118,(internal *)local_d8,
               (AssertionResult *)"rat.units() == precise::ratio","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,700,(char *)local_118);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
    if (local_118 != (undefined1  [8])&local_108) {
      operator_delete((void *)local_118,local_108._M_allocated_capacity + 1);
    }
    if (local_f0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_f0 + 8))();
    }
    if (uStack_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_d0,uStack_d0);
    }
  }
  local_d8 = (undefined1  [8])0x4000000000000000;
  uStack_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              0x3ff0000000000000;
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_118,"y.value()","2.0",2.0,2.0);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_110._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((_Alloc_hider *)&(_Stack_110._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2bf,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
    if (local_f0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_f0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_110._M_head_impl
      != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_110._M_head_impl);
  }
  local_118 = (undefined1  [8])0x4014000000000000;
  _Stack_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3ff0000000000000
  ;
  local_108._M_allocated_capacity = 1;
  units::fixed_precise_measurement::operator=
            ((fixed_precise_measurement *)local_d8,(precise_measurement *)local_118);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_118,"y.value()","5.0",(double)local_d8,5.0);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_110._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((_Alloc_hider *)&(_Stack_110._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2c1,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
    if (local_f0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_f0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_110._M_head_impl
      != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_110._M_head_impl);
  }
  local_d8 = (undefined1  [8])&DAT_401c000000000000;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_118,"y.value()","7.0",7.0,7.0);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_110._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((_Alloc_hider *)&(_Stack_110._M_head_impl)->field_0x0)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2c3,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
    if (local_f0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_f0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_110._M_head_impl
      != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_110._M_head_impl);
  }
  if ((SUB84(uStack_78,0) == -0x56b5b78 && NAN((double)local_88._8_8_)) ||
     (SUB84(uStack_78,0) == -0x56b5b78 || NAN((double)local_88._8_8_))) {
    local_f0[0] = (internal)0x0;
  }
  else {
    local_f0[0] = (internal)(!NAN((double)local_88._0_8_) && !NAN((double)local_88._0_8_));
    local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!NAN((double)local_88._0_8_)) goto LAB_0013e020;
  }
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::Message::Message((Message *)local_c0);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_118,(internal *)local_f0,(AssertionResult *)"is_valid(d1)","false",
             "true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_98,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
             ,0x2c4,(char *)local_118);
  testing::internal::AssertHelper::operator=(&local_98,(Message *)local_c0);
  testing::internal::AssertHelper::~AssertHelper(&local_98);
  if (local_118 != (undefined1  [8])&local_108) {
    operator_delete((void *)local_118,local_108._M_allocated_capacity + 1);
  }
  if (local_c0 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_c0 + 8))();
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
LAB_0013e020:
  units::fixed_precise_measurement::operator=
            ((fixed_precise_measurement *)local_48,(fixed_precise_measurement *)local_88);
  local_f0[0] = (internal)
                units::fixed_precise_measurement::operator==
                          ((fixed_precise_measurement *)local_48,
                           (fixed_precise_measurement *)local_88);
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_f0[0]) {
    testing::Message::Message((Message *)local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_118,(internal *)local_f0,(AssertionResult *)"d4 == d1","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2c7,(char *)local_118);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_118 != (undefined1  [8])&local_108) {
      operator_delete((void *)local_118,local_108._M_allocated_capacity + 1);
    }
    if (local_c0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
    if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e8,local_e8);
    }
  }
  local_118 = (undefined1  [8])local_48._8_8_;
  _Stack_110._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)dStack_38;
  local_f0[0] = (internal)
                units::precise_unit::operator==
                          ((precise_unit *)local_118,(precise_unit *)units::precise::ft);
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_f0[0]) {
    testing::Message::Message((Message *)local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_118,(internal *)local_f0,
               (AssertionResult *)"d4.units() == precise::ft","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2c8,(char *)local_118);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_118 != (undefined1  [8])&local_108) {
      operator_delete((void *)local_118,local_108._M_allocated_capacity + 1);
    }
    if (local_c0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
    if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e8,local_e8);
    }
  }
  return;
}

Assistant:

TEST(fixedPreciseMeasurement, ops)
{
    fixed_precise_measurement d1(45.0, precise::m);
    fixed_precise_measurement d2(79, precise::m);
    fixed_precise_measurement d4(1.0, precise::ft);
    auto area = d1 * d2;
    EXPECT_EQ(area.value(), 45.0 * 79);
    EXPECT_TRUE(area.units() == precise::m * precise::m);

    EXPECT_TRUE(d1 * d2 == d2 * d1);

    auto sum = d1 + d2;
    EXPECT_EQ(sum.value(), 45.0 + 79.0);
    EXPECT_TRUE(sum.units() == precise::m);
    EXPECT_TRUE(d1 + d2 == d2 + d1);

    auto diff = d2 - d1;
    EXPECT_EQ(diff.value(), 79.0 - 45);
    EXPECT_TRUE(diff.units() == precise::m);

    auto rat = d1 / d2;
    EXPECT_EQ(rat.value(), 45.0 / 79.0);
    EXPECT_TRUE(rat.units() == precise::ratio);

    fixed_precise_measurement y(2.0 * precise::m);
    EXPECT_DOUBLE_EQ(y.value(), 2.0);
    y = 5.0 * precise::m;
    EXPECT_DOUBLE_EQ(y.value(), 5.0);
    y = 7.0;
    EXPECT_DOUBLE_EQ(y.value(), 7.0);
    EXPECT_TRUE(is_valid(d1));

    d4 = d1;
    EXPECT_TRUE(d4 == d1);
    EXPECT_TRUE(d4.units() == precise::ft);
}